

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_sampling_brodnik(uchar **strings,size_t n)

{
  uchar *ptr;
  byte bVar1;
  bool bVar2;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root;
  undefined8 *puVar3;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *this;
  ulong uVar4;
  pointer in_RCX;
  size_t depth;
  long lVar5;
  
  root = (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 5000;
  for (uVar4 = 0; uVar4 < n; uVar4 = uVar4 + 0x2000) {
    ptr = strings[uVar4];
    depth = 0;
    this = root;
    while( true ) {
      bVar1 = get_char<unsigned_char>(ptr,depth);
      if (bVar1 == 0) break;
      TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::extend(this,bVar1 + 1);
      bVar2 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::is_trie(this,(uint)bVar1);
      if (!bVar2) {
        puVar3 = (undefined8 *)operator_new(0x18);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3[2] = 0;
        in_RCX = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 **)((long)in_RCX + (ulong)((uint)bVar1 * 8)) = puVar3;
        make_trie((void **)((ulong)((uint)bVar1 * 8) +
                           (long)(this->_buckets).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_start));
        lVar5 = lVar5 + -1;
        if (lVar5 == 0) goto LAB_001aa786;
      }
      this = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node(this,(uint)bVar1);
      depth = depth + 1;
      if (this == (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xd9,
                      "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = vector_brodnik<unsigned char *>]"
                     );
      }
    }
  }
LAB_001aa786:
  insert<16384u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
            (root,strings,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_brodnik(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_brodnik<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}